

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

bool __thiscall ON_Font::IsEngravingFont(ON_Font *this)

{
  bool bVar1;
  wchar_t *dirty_name;
  long lVar2;
  ON_wString *local_190;
  InternalHashToName *local_138;
  int local_11c;
  undefined1 auStack_118 [3];
  bool bIsEngravingFont;
  int j_1;
  ON__UINT8 local_110 [16];
  wchar_t *local_100;
  int local_f8;
  bool local_f1;
  int j;
  bool bSkipName;
  ON_wString *name;
  int local_e0;
  int i;
  int key_count;
  int name_count;
  InternalHashToName key [4];
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  ON_wString local_18;
  ON_Font *this_local;
  
  local_18.m_s = (wchar_t *)this;
  FamilyName((ON_Font *)local_38);
  FamilyName((ON_Font *)(local_38 + 8),(NameLocale)this);
  PostScriptName((ON_Font *)local_28);
  PostScriptName((ON_Font *)(local_28 + 8),(NameLocale)this);
  local_138 = (InternalHashToName *)&key_count;
  do {
    InternalHashToName::InternalHashToName(local_138);
    local_138 = local_138 + 1;
  } while (local_138 != (InternalHashToName *)&key[3].m_family_name);
  i = 4;
  local_e0 = 0;
  name._4_4_ = 0;
  do {
    if (3 < name._4_4_) {
      this_local._7_1_ = 0;
LAB_00636591:
      local_190 = &local_18;
      do {
        local_190 = local_190 + -1;
        ON_wString::~ON_wString(local_190);
      } while (local_190 != (ON_wString *)local_38);
      return (bool)(this_local._7_1_ & 1);
    }
    _j = (ON_wString *)(local_38 + (long)name._4_4_ * 8);
    bVar1 = ON_wString::IsEmpty(_j);
    if (!bVar1) {
      local_f1 = ON_wString::IsEmpty(_j);
      for (local_f8 = 0; local_f1 == false && local_f8 < name._4_4_; local_f8 = local_f8 + 1) {
        local_f1 = ::operator==(_j,(ON_wString *)(local_38 + (long)local_f8 * 8));
      }
      if (local_f1 == false) {
        dirty_name = ON_wString::operator_cast_to_wchar_t_(_j);
        InternalHashToName::InternalHashToName
                  ((InternalHashToName *)auStack_118,dirty_name,(wchar_t *)0x0);
        lVar2 = (long)local_e0;
        *(undefined8 *)(&key_count + lVar2 * 8) = _auStack_118;
        *(undefined8 *)key[lVar2].m_dirty_name_hash.m_digest = local_110._0_8_;
        *(undefined8 *)(key[lVar2].m_dirty_name_hash.m_digest + 8) = local_110._8_8_;
        *(wchar_t **)(key[lVar2].m_dirty_name_hash.m_digest + 0x10) = local_100;
        for (local_11c = 0; (local_f1 & 1U) == 0 && local_11c < local_e0; local_11c = local_11c + 1)
        {
          local_f1 = ::operator==((ON_SHA1_Hash *)(&key_count + (long)local_e0 * 8),
                                  (ON_SHA1_Hash *)(&key_count + (long)name._4_4_ * 8));
        }
        if ((local_f1 & 1U) == 0) {
          bVar1 = Internal_IsEngravingFont((InternalHashToName *)(&key_count + (long)local_e0 * 8));
          local_e0 = local_e0 + 1;
          if (bVar1) {
            this_local._7_1_ = 1;
            goto LAB_00636591;
          }
        }
      }
    }
    name._4_4_ = name._4_4_ + 1;
  } while( true );
}

Assistant:

bool ON_Font::IsEngravingFont() const
{
  const ON_wString names[] =
  {
    FamilyName(),
    FamilyName(ON_Font::NameLocale::English),
    PostScriptName(),
    PostScriptName(ON_Font::NameLocale::English)
  };
  
  InternalHashToName key[sizeof(names)/sizeof(names[0])];

  const int name_count = (int)(sizeof(names) / sizeof(names[0]));
  int key_count = 0;
  for (int i = 0; i < name_count; i++)
  {
    const ON_wString& name = names[i];
    if (name.IsEmpty())
      continue;

    // computing the hash is much more expensive than checking for duplicate names (which is common)
    bool bSkipName = name.IsEmpty();
    for (int j = 0; false == bSkipName && j < i; j++)
      bSkipName = (name == names[j]);
    if (bSkipName)
      continue;

    // compute name hash
    key[key_count] = InternalHashToName(name, nullptr);

    // searching for a duplicate hash is more expensive than checking for duplicate hash 
    // (which is common because of space and hyphen differences between family and postscript names)
    for (int j = 0; false == bSkipName && j < key_count; j++)
      bSkipName = (key[key_count].m_dirty_name_hash == key[i].m_dirty_name_hash);
    if (bSkipName)
      continue;

    // search for matching name hash is lists of known single stroke and double stroke fonts
    bool bIsEngravingFont = Internal_IsEngravingFont(&key[key_count]);
    key_count++;
    if (bIsEngravingFont)
      return true;
  }
  return false;
}